

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::Swap
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  int iVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (this != other) {
    ppvVar2 = this->elements_;
    iVar1 = this->total_size_;
    this->elements_ = other->elements_;
    iVar3 = other->allocated_size_;
    other->elements_ = ppvVar2;
    iVar4 = this->current_size_;
    iVar5 = this->allocated_size_;
    this->current_size_ = other->current_size_;
    this->allocated_size_ = iVar3;
    this->total_size_ = other->total_size_;
    other->current_size_ = iVar4;
    other->allocated_size_ = iVar5;
    other->total_size_ = iVar1;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Swap(RepeatedPtrFieldBase* other) {
  if (this == other) return;
  void** swap_elements       = elements_;
  int    swap_current_size   = current_size_;
  int    swap_allocated_size = allocated_size_;
  int    swap_total_size     = total_size_;

  elements_       = other->elements_;
  current_size_   = other->current_size_;
  allocated_size_ = other->allocated_size_;
  total_size_     = other->total_size_;

  other->elements_       = swap_elements;
  other->current_size_   = swap_current_size;
  other->allocated_size_ = swap_allocated_size;
  other->total_size_     = swap_total_size;
}